

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O0

ParamGenerator<(anonymous_namespace)::CcsTestCase> __thiscall
testing::
ValuesIn<std::vector<(anonymous_namespace)::CcsTestCase,std::allocator<(anonymous_namespace)::CcsTestCase>>>
          (testing *this,
          vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
          *container)

{
  const_iterator begin;
  const_iterator end;
  ParamGenerator<(anonymous_namespace)::CcsTestCase> PVar1;
  vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
  *container_local;
  
  begin = std::
          vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
          ::begin(container);
  end = std::
        vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
        ::end(container);
  PVar1 = ValuesIn<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CcsTestCase_const*,std::vector<(anonymous_namespace)::CcsTestCase,std::allocator<(anonymous_namespace)::CcsTestCase>>>>
                    (this,(__normal_iterator<const_(anonymous_namespace)::CcsTestCase_*,_std::vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>_>
                           )begin._M_current,
                     (__normal_iterator<const_(anonymous_namespace)::CcsTestCase_*,_std::vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>_>
                      )end._M_current);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<(anonymous_namespace)::CcsTestCase>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<typename Container::value_type> ValuesIn(
    const Container& container) {
  return ValuesIn(container.begin(), container.end());
}